

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O1

Var Js::GlobalObject::EntryEvalHelper
              (ScriptContext *scriptContext,RecyclableObject *function,Arguments *args)

{
  bool bVar1;
  FrameDisplay *environment;
  Var pvVar2;
  undefined1 strictMode;
  
  if ((SUB84(args->Info,0) & 0x48000000) == 0x8000000) {
    if (((ulong)args->Info & 0xffffff) == 0) {
      environment = (FrameDisplay *)&NullFrameDisplay;
      strictMode = 0;
    }
    else {
      environment = Arguments::GetFrameDisplay(args);
      strictMode = environment->strictMode;
    }
    bVar1 = false;
  }
  else {
    bVar1 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FastIndirectEvalPhase);
    bVar1 = !bVar1;
    environment = (FrameDisplay *)&NullFrameDisplay;
    strictMode = false;
  }
  pvVar2 = VEval((((function->type).ptr)->javascriptLibrary).ptr,environment,0,(bool)strictMode,
                 bVar1,args,false,true,0,(ScriptContext *)0x0);
  return pvVar2;
}

Assistant:

Var GlobalObject::EntryEvalHelper(ScriptContext* scriptContext, RecyclableObject* function, Js::Arguments& args)
    {
        FrameDisplay* environment = (FrameDisplay*)&NullFrameDisplay;
        ModuleID moduleID = kmodGlobal;
        BOOL strictMode = FALSE;
        // TODO: Handle call from global scope, strict mode
        BOOL isIndirect = FALSE;

        if (args.IsDirectEvalCall())
        {
            // This was recognized as an eval call at compile time. The last one or two args are internal to us.
            // Argcount will be one of the following when called from global code
            //  - eval("...")     : argcount 3 : this, evalString, frameDisplay
            //  - eval.call("..."): argcount 2 : this(which is string) , frameDisplay
            if (args.Info.Count >= 1)
            {
                environment = args.GetFrameDisplay();
                strictMode = environment->GetStrictMode();
            }
        }
        else
        {
            // This must be an indirect "eval" call that we didn't detect at compile time.
            // Pass null as the environment, which will force all lookups in the eval code
            // to use the root for the current module.
            // Also pass "null" for "this", which will force the callee to use the current module root.
            isIndirect = !PHASE_OFF1(Js::FastIndirectEvalPhase);
        }

        return GlobalObject::VEval(function->GetLibrary(), environment, moduleID, !!strictMode, !!isIndirect, args,
            /* isLibraryCode = */ false, /* registerDocument */ true, /*additionalGrfscr */ 0);
    }